

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O2

void __thiscall
CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::hashtable_iterator::to_next_data
          (hashtable_iterator *this)

{
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar2;
  pointer ppVar3;
  
  pvVar1 = (this->mEndBucketItr)._M_current;
  ppVar3 = (this->mCurValueItr)._M_current;
  pvVar2 = (this->mCurBucketItr)._M_current;
  while ((pvVar2 != pvVar1 &&
         (ppVar3 == (pvVar2->
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                    _M_impl.super__Vector_impl_data._M_finish))) {
    pvVar2 = pvVar2 + 1;
    (this->mCurBucketItr)._M_current = pvVar2;
    if (pvVar2 == pvVar1) {
      return;
    }
    ppVar3 = (pvVar2->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    (this->mCurValueItr)._M_current = ppVar3;
  }
  return;
}

Assistant:

void to_next_data() {
          while (mCurBucketItr != mEndBucketItr &&
                 mCurValueItr == mCurBucketItr->end()) {
            mCurBucketItr++;
            if (mCurBucketItr == mEndBucketItr) break;
            mCurValueItr = mCurBucketItr->begin();
          }
        }